

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

IfGenerateSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::IfGenerateSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::parsing::Token,slang::parsing::Token,slang::syntax::ExpressionSyntax&,slang::parsing::Token,slang::syntax::MemberSyntax&,slang::syntax::ElseClauseSyntax*>
          (BumpAllocator *this,SyntaxList<slang::syntax::AttributeInstanceSyntax> *args,
          Token *args_1,Token *args_2,ExpressionSyntax *args_3,Token *args_4,MemberSyntax *args_5,
          ElseClauseSyntax **args_6)

{
  Token closeParen;
  IfGenerateSyntax *this_00;
  MemberSyntax *in_RCX;
  ElseClauseSyntax *in_RDX;
  Info *in_R8;
  Token *in_R9;
  undefined8 *in_stack_00000010;
  size_t in_stack_ffffffffffffff78;
  size_t in_stack_ffffffffffffff80;
  BumpAllocator *in_stack_ffffffffffffff88;
  
  this_00 = (IfGenerateSyntax *)
            allocate(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  closeParen.info = in_R8;
  closeParen._0_8_ = in_R9;
  slang::syntax::IfGenerateSyntax::IfGenerateSyntax
            (this_00,(SyntaxList<slang::syntax::AttributeInstanceSyntax> *)*in_stack_00000010,
             *(Token *)&in_RCX->super_SyntaxNode,*in_R9,
             (ExpressionSyntax *)(in_RDX->super_SyntaxNode).parent,closeParen,in_RCX,in_RDX);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }